

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugmodes.c
# Opt level: O0

void av1_print_frame_contexts(FRAME_CONTEXT *fc,char *filename)

{
  FILE *__stream;
  char *in_RSI;
  ushort *in_RDI;
  uint i;
  uint n_contexts;
  uint16_t *fcp;
  FILE *fcFile;
  uint local_28;
  ushort *local_20;
  
  __stream = fopen64(in_RSI,"w");
  local_20 = in_RDI;
  for (local_28 = 0; local_28 < 0x297e; local_28 = local_28 + 1) {
    fprintf(__stream,"%d ",(ulong)*local_20);
    local_20 = local_20 + 1;
  }
  fclose(__stream);
  return;
}

Assistant:

void av1_print_frame_contexts(const FRAME_CONTEXT *fc, const char *filename) {
  FILE *fcFile = fopen(filename, "w");
  const uint16_t *fcp = (uint16_t *)fc;
  const unsigned int n_contexts = sizeof(FRAME_CONTEXT) / sizeof(uint16_t);
  unsigned int i;

  for (i = 0; i < n_contexts; ++i) fprintf(fcFile, "%d ", *fcp++);
  fclose(fcFile);
}